

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressBegin_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  ZSTD_paramSwitch_e ZVar1;
  void *pvVar2;
  void *pvVar3;
  U32 *pUVar4;
  U32 *pUVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  ZSTD_compressionParameters cPar;
  U32 UVar19;
  U32 end;
  int iVar20;
  uint uVar21;
  U32 UVar22;
  ZSTD_TraceCtx ZVar23;
  size_t sVar24;
  ulong uVar25;
  size_t sVar26;
  size_t sVar27;
  long lVar28;
  byte bVar29;
  size_t tagTableSize;
  size_t sVar30;
  ZSTD_matchState_t *srcMatchState;
  long lVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  uint uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  ZSTD_strategy ZStack_120;
  ZSTD_CCtx_params local_100;
  
  sVar24 = dictSize;
  if (cdict != (ZSTD_CDict *)0x0) {
    sVar24 = cdict->dictContentSize;
  }
  ZVar23 = ZSTD_trace_compress_begin(cctx);
  cctx->traceCtx = ZVar23;
  if ((((((params->cParams).windowLog - 0x20 < 0xffffffea) ||
        ((params->cParams).chainLog - 0x1f < 0xffffffe7)) ||
       ((params->cParams).hashLog - 0x1f < 0xffffffe7)) ||
      (((params->cParams).searchLog - 0x1f < 0xffffffe2 || (4 < (params->cParams).minMatch - 3))))
     || ((0x20000 < (params->cParams).targetLength || (8 < (params->cParams).strategy - ZSTD_fast)))
     ) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params->cParams))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x1396,
                  "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                 );
  }
  if (dict != (void *)0x0 && cdict != (ZSTD_CDict *)0x0) {
    __assert_fail("!((dict) && (cdict))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x1397,
                  "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                 );
  }
  if ((((cdict == (ZSTD_CDict *)0x0) || (sVar26 = cdict->dictContentSize, sVar26 == 0)) ||
      ((0x1ffff < pledgedSrcSize &&
       (((pledgedSrcSize != 0xffffffffffffffff && (sVar26 * 6 <= pledgedSrcSize)) &&
        (cdict->compressionLevel != 0)))))) || (params->attachDictPref == ZSTD_dictForceLoad)) {
    sVar26 = ZSTD_resetCCtx_internal(cctx,params,pledgedSrcSize,sVar24,ZSTDcrp_makeClean,zbuff);
    if (0xffffffffffffff88 < sVar26) {
      return sVar26;
    }
    if (cdict == (ZSTD_CDict *)0x0) {
      uVar32 = SUB84(cctx->entropyWorkspace,0);
      uVar33 = (undefined4)((ulong)cctx->entropyWorkspace >> 0x20);
    }
    else {
      dict = cdict->dictContent;
      dictContentType = cdict->dictContentType;
      uVar32 = SUB84(cctx->entropyWorkspace,0);
      uVar33 = (undefined4)((ulong)cctx->entropyWorkspace >> 0x20);
      dictSize = cdict->dictContentSize;
    }
    sVar26 = ZSTD_compress_insertDictionary
                       ((cctx->blockState).prevCBlock,&(cctx->blockState).matchState,&cctx->ldmState
                        ,&cctx->workspace,&cctx->appliedParams,dict,dictSize,dictContentType,dtlm,
                        ZSTD_tfp_forCCtx,(void *)CONCAT44(uVar33,uVar32));
    if (sVar26 < 0xffffffffffffff89) {
      if (sVar26 >> 0x20 == 0) {
        cctx->dictID = (U32)sVar26;
        cctx->dictContentSize = sVar24;
        return 0;
      }
      __assert_fail("dictID <= UINT_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x13b0,
                    "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                   );
    }
    return sVar26;
  }
  iVar20 = ZSTD_shouldAttachDict(cdict,params,pledgedSrcSize);
  if (iVar20 == 0) {
    memcpy(&local_100,params,0xd0);
    if ((cdict->matchState).dedicatedDictSearch != 0) {
      __assert_fail("!cdict->matchState.dedicatedDictSearch",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x932,
                    "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    if (local_100.cParams.windowLog == 0) {
      __assert_fail("windowLog != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x937,
                    "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    uVar13 = (cdict->matchState).cParams.chainLog;
    uVar14 = (cdict->matchState).cParams.hashLog;
    uVar15 = (cdict->matchState).cParams.searchLog;
    uVar16 = (cdict->matchState).cParams.minMatch;
    local_100.cParams.targetLength = (cdict->matchState).cParams.targetLength;
    local_100.cParams.strategy = (cdict->matchState).cParams.strategy;
    local_100.cParams.chainLog = uVar13;
    ZVar1 = cdict->useRowMatchFinder;
    local_100.cParams.hashLog = uVar14;
    local_100.cParams.searchLog = uVar15;
    local_100.cParams.minMatch = uVar16;
    local_100.useRowMatchFinder = ZVar1;
    sVar24 = ZSTD_resetCCtx_internal(cctx,&local_100,pledgedSrcSize,0,ZSTDcrp_leaveDirty,zbuff);
    if (0xffffffffffffff88 < sVar24) {
      return sVar24;
    }
    if ((cctx->appliedParams).cParams.strategy != (cdict->matchState).cParams.strategy) {
      __assert_fail("cctx->appliedParams.cParams.strategy == cdict_cParams->strategy",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x93f,
                    "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    if ((cctx->appliedParams).cParams.hashLog != (cdict->matchState).cParams.hashLog) {
      __assert_fail("cctx->appliedParams.cParams.hashLog == cdict_cParams->hashLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x940,
                    "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    if ((cctx->appliedParams).cParams.chainLog != (cdict->matchState).cParams.chainLog) {
      __assert_fail("cctx->appliedParams.cParams.chainLog == cdict_cParams->chainLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x941,
                    "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    pvVar2 = (cctx->workspace).objectEnd;
    pvVar3 = (cctx->workspace).tableValidEnd;
    if (pvVar3 < pvVar2) {
      __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x222,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
    }
    if ((cctx->workspace).allocStart < pvVar3) {
      __assert_fail("ws->tableValidEnd <= ws->allocStart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x223,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
    }
    (cctx->workspace).tableValidEnd = pvVar2;
    ZSTD_cwksp_assert_internal_consistency(&cctx->workspace);
    if (ZVar1 == ZSTD_ps_auto) {
      __assert_fail("params.useRowMatchFinder != ZSTD_ps_auto",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x945,
                    "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    lVar31 = 0;
    iVar20 = ZSTD_allocateChainTable
                       ((cdict->matchState).cParams.strategy,cdict->useRowMatchFinder,0);
    if (iVar20 != 0) {
      lVar31 = 1L << ((byte)(cdict->matchState).cParams.chainLog & 0x3f);
    }
    bVar29 = (byte)(cdict->matchState).cParams.hashLog;
    sVar30 = 1L << (bVar29 & 0x3f);
    pUVar4 = (cctx->blockState).matchState.hashTable;
    pUVar5 = (cdict->matchState).hashTable;
    if ((cdict->matchState).cParams.strategy - ZSTD_greedy < 0xfffffffe) {
      memcpy(pUVar4,pUVar5,4L << (bVar29 & 0x3f));
    }
    else {
      sVar27 = 0;
      do {
        pUVar4[sVar27] = pUVar5[sVar27] >> 8;
        sVar27 = sVar27 + 1;
      } while (sVar30 != sVar27);
    }
    iVar20 = ZSTD_allocateChainTable
                       ((cctx->appliedParams).cParams.strategy,
                        (cctx->appliedParams).useRowMatchFinder,0);
    if (iVar20 != 0) {
      pUVar4 = (cctx->blockState).matchState.chainTable;
      pUVar5 = (cdict->matchState).chainTable;
      if ((cdict->matchState).cParams.strategy - ZSTD_greedy < 0xfffffffe) {
        memcpy(pUVar4,pUVar5,lVar31 << 2);
      }
      else if (lVar31 != 0) {
        lVar28 = 0;
        do {
          pUVar4[lVar28] = pUVar5[lVar28] >> 8;
          lVar28 = lVar28 + 1;
        } while (lVar31 != lVar28);
      }
    }
    if (cdict->useRowMatchFinder == ZSTD_ps_auto) {
      __assert_fail("mode != ZSTD_ps_auto",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0xe6,
                    "int ZSTD_rowMatchFinderUsed(const ZSTD_strategy, const ZSTD_paramSwitch_e)");
    }
    if ((cdict->useRowMatchFinder == ZSTD_ps_enable) &&
       (0xfffffffc < (cdict->matchState).cParams.strategy - ZSTD_btlazy2)) {
      memcpy((cctx->blockState).matchState.tagTable,(cdict->matchState).tagTable,sVar30);
      (cctx->blockState).matchState.hashSalt = (cdict->matchState).hashSalt;
    }
    if ((cdict->matchState).hashLog3 != 0) {
      __assert_fail("cdict->matchState.hashLog3 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x964,
                    "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    UVar22 = (cctx->blockState).matchState.hashLog3;
    sVar30 = 0;
    if (UVar22 != 0) {
      sVar30 = 4L << ((byte)UVar22 & 0x3f);
    }
    memset((cctx->blockState).matchState.hashTable3,0,sVar30);
    pvVar2 = (cctx->workspace).tableValidEnd;
    if (pvVar2 < (cctx->workspace).objectEnd) {
      __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x22a,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
    }
    if ((cctx->workspace).allocStart < pvVar2) {
      __assert_fail("ws->tableValidEnd <= ws->allocStart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x22b,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
    }
    pvVar3 = (cctx->workspace).tableEnd;
    if (pvVar2 < pvVar3) {
      (cctx->workspace).tableValidEnd = pvVar3;
    }
    ZSTD_cwksp_assert_internal_consistency(&cctx->workspace);
    uVar32 = *(undefined4 *)&(cdict->matchState).window.field_0x24;
    (cctx->blockState).matchState.window.nbOverflowCorrections =
         (cdict->matchState).window.nbOverflowCorrections;
    *(undefined4 *)&(cctx->blockState).matchState.window.field_0x24 = uVar32;
    pBVar17 = (cdict->matchState).window.nextSrc;
    pBVar18 = (cdict->matchState).window.base;
    UVar22 = (cdict->matchState).window.dictLimit;
    UVar19 = (cdict->matchState).window.lowLimit;
    (cctx->blockState).matchState.window.dictBase = (cdict->matchState).window.dictBase;
    (cctx->blockState).matchState.window.dictLimit = UVar22;
    (cctx->blockState).matchState.window.lowLimit = UVar19;
    (cctx->blockState).matchState.window.nextSrc = pBVar17;
    (cctx->blockState).matchState.window.base = pBVar18;
    (cctx->blockState).matchState.nextToUpdate = (cdict->matchState).nextToUpdate;
    UVar22 = (cdict->matchState).loadedDictEnd;
  }
  else {
    memcpy(&local_100,params,0xd0);
    uVar6 = (cdict->matchState).cParams.windowLog;
    uVar7 = (cdict->matchState).cParams.chainLog;
    cPar.chainLog = uVar7;
    cPar.windowLog = uVar6;
    uVar8 = (cdict->matchState).cParams.hashLog;
    uVar9 = (cdict->matchState).cParams.searchLog;
    uVar10 = (cdict->matchState).cParams.minMatch;
    uVar11 = (cdict->matchState).cParams.targetLength;
    uVar12 = (cdict->matchState).cParams.strategy;
    uVar21 = local_100.cParams.windowLog;
    if (local_100.cParams.windowLog == 0) {
      __assert_fail("windowLog != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x8e8,
                    "size_t ZSTD_resetCCtx_byAttachingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    uStack_130 = uVar8;
    if (((cdict->matchState).dedicatedDictSearch != 0) &&
       (uStack_130 = uVar8, uVar12 - ZSTD_greedy < 3)) {
      uStack_130 = 6;
      if (6 < uVar8 - 2) {
        uStack_130 = uVar8 - 2;
      }
    }
    cPar.hashLog = uStack_130;
    cPar.searchLog = uVar9;
    cPar.minMatch = uVar10;
    cPar.targetLength = uVar11;
    cPar.strategy = uVar12;
    ZSTD_adjustCParams_internal
              (&local_100.cParams,cPar,pledgedSrcSize,sVar26,ZSTD_cpm_attachDict,
               local_100.useRowMatchFinder);
    local_100.cParams._0_8_ = CONCAT44(local_100.cParams.chainLog,uVar21);
    local_100.useRowMatchFinder = cdict->useRowMatchFinder;
    sVar24 = ZSTD_resetCCtx_internal(cctx,&local_100,pledgedSrcSize,0,ZSTDcrp_makeClean,zbuff);
    if (0xffffffffffffff88 < sVar24) {
      return sVar24;
    }
    if ((cctx->appliedParams).cParams.strategy != uVar12) {
      __assert_fail("cctx->appliedParams.cParams.strategy == adjusted_cdict_cParams.strategy",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x8f9,
                    "size_t ZSTD_resetCCtx_byAttachingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    uVar25 = (long)(cdict->matchState).window.nextSrc - (long)(cdict->matchState).window.base;
    uVar21 = (uint)uVar25;
    if ((cdict->matchState).window.dictLimit == uVar21) goto LAB_001b9503;
    (cctx->blockState).matchState.dictMatchState = &cdict->matchState;
    if ((cctx->blockState).matchState.window.dictLimit < uVar21) {
      (cctx->blockState).matchState.window.nextSrc =
           (cctx->blockState).matchState.window.base + (uVar25 & 0xffffffff);
      (cctx->blockState).matchState.window.lowLimit = uVar21;
      (cctx->blockState).matchState.window.dictLimit = uVar21;
    }
    UVar22 = (cctx->blockState).matchState.window.dictLimit;
  }
  (cctx->blockState).matchState.loadedDictEnd = UVar22;
LAB_001b9503:
  cctx->dictID = cdict->dictID;
  cctx->dictContentSize = cdict->dictContentSize;
  memcpy((cctx->blockState).prevCBlock,&cdict->cBlockState,0x1600);
  return 0;
}

Assistant:

static size_t ZSTD_compressBegin_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params, U64 pledgedSrcSize,
                                    ZSTD_buffered_policy_e zbuff)
{
    size_t const dictContentSize = cdict ? cdict->dictContentSize : dictSize;
#if ZSTD_TRACE
    cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
    DEBUGLOG(4, "ZSTD_compressBegin_internal: wlog=%u", params->cParams.windowLog);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if ( (cdict)
      && (cdict->dictContentSize > 0)
      && ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
        || cdict->compressionLevel == 0)
      && (params->attachDictPref != ZSTD_dictForceLoad) ) {
        return ZSTD_resetCCtx_usingCDict(cctx, cdict, params, pledgedSrcSize, zbuff);
    }

    FORWARD_IF_ERROR( ZSTD_resetCCtx_internal(cctx, params, pledgedSrcSize,
                                     dictContentSize,
                                     ZSTDcrp_makeClean, zbuff) , "");
    {   size_t const dictID = cdict ?
                ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, cdict->dictContent,
                        cdict->dictContentSize, cdict->dictContentType, dtlm,
                        ZSTD_tfp_forCCtx, cctx->entropyWorkspace)
              : ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, dict, dictSize,
                        dictContentType, dtlm, ZSTD_tfp_forCCtx, cctx->entropyWorkspace);
        FORWARD_IF_ERROR(dictID, "ZSTD_compress_insertDictionary failed");
        assert(dictID <= UINT_MAX);
        cctx->dictID = (U32)dictID;
        cctx->dictContentSize = dictContentSize;
    }
    return 0;
}